

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.cpp
# Opt level: O2

InplaceStr GetTypeNameInScope(ExpressionContext *ctx,ScopeData *scope,InplaceStr str)

{
  NamespaceData *pNVar1;
  bool bVar2;
  int iVar3;
  ScopeData *curr;
  ScopeData *pSVar4;
  undefined4 extraout_var;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  ScopeData *curr_1;
  char *pcVar8;
  uint strLength;
  ulong uVar9;
  InplaceStr IVar10;
  char *__s;
  
  pcVar8 = str.end;
  pcVar6 = str.begin;
  uVar9 = (long)pcVar8 - (long)pcVar6;
  bVar2 = false;
  uVar7 = uVar9 & 0xffffffff;
  for (pSVar4 = scope; pSVar4 != (ScopeData *)0x0; pSVar4 = pSVar4->scope) {
    if (((pSVar4->ownerType != (TypeBase *)0x0) || (pSVar4->ownerFunction != (FunctionData *)0x0))
       && (!bVar2)) goto LAB_00206b9c;
    pNVar1 = pSVar4->ownerNamespace;
    if (pNVar1 != (NamespaceData *)0x0) {
      uVar7 = (ulong)((int)uVar7 +
                      (*(int *)&(pNVar1->name).name.end - *(int *)&(pNVar1->name).name.begin) + 1);
      bVar2 = true;
    }
  }
  if (bVar2) {
    uVar7 = (ulong)((int)uVar7 + 1);
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,uVar7);
    __s = (char *)CONCAT44(extraout_var,iVar3);
    pcVar8 = __s + (uVar7 - 1);
    *pcVar8 = '\0';
    if ((int)uVar9 != 0) {
      pcVar8 = pcVar8 + -(uVar9 & 0xffffffff);
      memcpy(pcVar8,pcVar6,uVar9 & 0xffffffff);
    }
    for (; scope != (ScopeData *)0x0; scope = scope->scope) {
      pNVar1 = scope->ownerNamespace;
      if (pNVar1 != (NamespaceData *)0x0) {
        pcVar6 = (pNVar1->name).name.begin;
        iVar3 = *(int *)&(pNVar1->name).name.end;
        pcVar8[-1] = '.';
        uVar7 = (ulong)(uint)(iVar3 - (int)pcVar6);
        pcVar8 = pcVar8 + (-1 - uVar7);
        memcpy(pcVar8,pcVar6,uVar7);
      }
    }
    if (pcVar8 != __s) {
      __assert_fail("pos == name",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.cpp"
                    ,0x23c,
                    "InplaceStr GetTypeNameInScope(ExpressionContext &, ScopeData *, InplaceStr)");
    }
    sVar5 = strlen(__s);
    pcVar8 = __s + sVar5;
    pcVar6 = __s;
  }
LAB_00206b9c:
  IVar10.end = pcVar8;
  IVar10.begin = pcVar6;
  return IVar10;
}

Assistant:

InplaceStr GetTypeNameInScope(ExpressionContext &ctx, ScopeData *scope, InplaceStr str)
{
	bool foundNamespace = false;

	unsigned nameLength = str.length();

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if((curr->ownerType || curr->ownerFunction) && !foundNamespace)
			break;

		if(curr->ownerNamespace)
		{
			nameLength += curr->ownerNamespace->name.name.length() + 1;

			foundNamespace = true;
		}
	}

	nameLength += 1;

	if(!foundNamespace)
		return str;

	char *name = (char*)ctx.allocator->alloc(nameLength);

	// Format a string back-to-front
	char *pos = name + nameLength;

	pos -= 1;
	*pos = 0;

	if(unsigned strLength = str.length())
	{
		pos -= strLength;
		memcpy(pos, str.begin, strLength);
	}

	for(ScopeData *curr = scope; curr; curr = curr->scope)
	{
		if(curr->ownerNamespace)
		{
			InplaceStr nsName = curr->ownerNamespace->name.name;

			pos -= 1;
			*pos = '.';

			pos -= nsName.length();
			memcpy(pos, nsName.begin, nsName.length());
		}
	}

	assert(pos == name);

	return InplaceStr(name);
}